

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Problem_CGBG_FF::FilterObservationsForHouse
          (Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  allocator_type *paVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  value_type in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index o;
  vector<unsigned_int,_std::allocator<unsigned_int>_> obsIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *obsHouseIndices;
  Index typeI;
  Index agI;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *allObservationsForHouse_hI;
  value_type_conflict1 *in_stack_ffffffffffffff28;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Index in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  const_reference local_50;
  value_type local_38;
  value_type local_34;
  uint local_30;
  undefined1 local_29;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  value_type local_14;
  
  local_29 = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8ede65);
  for (local_30 = 0; uVar1 = (ulong)local_30,
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_20),
      uVar1 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_20,(ulong)local_30);
    local_34 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    local_38 = *pvVar3;
    local_50 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::at(in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_50);
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffff97;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8edf33);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (this_00,sVar2,in_stack_ffffffffffffff40);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8edf53);
    TypeIndexToObservationIndices
              ((Problem_CGBG_FF *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_RSI);
    in_stack_ffffffffffffff90 = 0;
    while( true ) {
      in_stack_ffffffffffffff40 = (allocator_type *)(ulong)in_stack_ffffffffffffff90;
      paVar4 = (allocator_type *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_68);
      if (paVar4 <= in_stack_ffffffffffffff40) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
      if (*pvVar3 == local_14) {
        in_stack_ffffffffffffff30 =
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff8c =
             *(Index *)&(in_stack_ffffffffffffff30->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
      }
      in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff40);
  }
  return in_RDI;
}

Assistant:

vector<Problem_CGBG_FF::observation_t> Problem_CGBG_FF::FilterObservationsForHouse(
        Index hI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
    ) const
{
    vector<Problem_CGBG_FF::observation_t> allObservationsForHouse_hI;

    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents[i];
        Index typeI = types.at(i);
        //vector<Index> obsIndices = TypeIndexToObservationIndices(agI, typeAgI);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        vector<Index> obsIndices(obsHouseIndices.size());
        TypeIndexToObservationIndices(typeI, obsIndices);
#if DEBUGPROBS
        cout << "\tAgent " << agI << ", observations: " << SoftPrintVector(obsIndices) <<
            " for houses:" << SoftPrintVector(obsHouseIndices) << " (typeI="<<typeI<<")"<<endl;
#endif
 
        for(Index o=0; o < obsIndices.size(); o++)
            if(obsHouseIndices.at(o) == hI)
                allObservationsForHouse_hI.push_back(
                    (Problem_CGBG_FF::observation_t) obsIndices.at(o)
                    );
    }
    return allObservationsForHouse_hI;
}